

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpropertyanimation.cpp
# Opt level: O0

void QPropertyAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined8 *puVar2;
  QObject *pQVar3;
  long *in_RCX;
  uint in_EDX;
  int in_ESI;
  QPropertyAnimation *in_RDI;
  long in_FS_OFFSET;
  QBindable<QByteArray> QVar4;
  QBindable<QObject_*> QVar5;
  void *_v_1;
  void *_v;
  QPropertyAnimation *_t;
  QByteArray *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint uVar6;
  QUntypedPropertyData *local_40;
  QBindableInterface *local_38;
  QUntypedPropertyData *local_30;
  QBindableInterface *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    puVar2 = (undefined8 *)*in_RCX;
    if (in_EDX == 0) {
      uVar6 = in_EDX;
      propertyName((QPropertyAnimation *)(ulong)in_stack_ffffffffffffff88);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      QByteArray::~QByteArray((QByteArray *)0x683cdd);
      in_stack_ffffffffffffff8c = in_EDX;
      in_EDX = uVar6;
    }
    else {
      in_stack_ffffffffffffff8c = in_EDX;
      if (in_EDX == 1) {
        uVar6 = in_EDX;
        pQVar3 = targetObject((QPropertyAnimation *)0x683ce9);
        *puVar2 = pQVar3;
        in_stack_ffffffffffffff8c = in_EDX;
        in_EDX = uVar6;
      }
    }
  }
  if (in_ESI == 2) {
    if (in_EDX == 0) {
      uVar6 = in_EDX;
      setPropertyName((QPropertyAnimation *)((ulong)in_stack_ffffffffffffff8c << 0x20),
                      (QByteArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      in_stack_ffffffffffffff88 = in_EDX;
      in_EDX = uVar6;
    }
    else {
      in_stack_ffffffffffffff88 = in_EDX;
      if (in_EDX == 1) {
        uVar6 = in_EDX;
        setTargetObject(in_RDI,(QObject *)0x200000001);
        in_stack_ffffffffffffff88 = in_EDX;
        in_EDX = uVar6;
      }
    }
  }
  if (in_ESI == 8) {
    if (in_EDX == 0) {
      QVar4 = bindablePropertyName
                        ((QPropertyAnimation *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      puVar2 = (undefined8 *)*in_RCX;
      local_30 = QVar4.super_QUntypedBindable.data;
      *puVar2 = local_30;
      local_28 = QVar4.super_QUntypedBindable.iface;
      puVar2[1] = local_28;
    }
    else if (in_EDX == 1) {
      QVar5 = bindableTargetObject
                        ((QPropertyAnimation *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      puVar2 = (undefined8 *)*in_RCX;
      local_40 = QVar5.super_QUntypedBindable.data;
      *puVar2 = local_40;
      local_38 = QVar5.super_QUntypedBindable.iface;
      puVar2[1] = local_38;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPropertyAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QByteArray*>(_v) = _t->propertyName(); break;
        case 1: *reinterpret_cast<QObject**>(_v) = _t->targetObject(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPropertyName(*reinterpret_cast<QByteArray*>(_v)); break;
        case 1: _t->setTargetObject(*reinterpret_cast<QObject**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindablePropertyName(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTargetObject(); break;
        default: break;
        }
    }
}